

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strbuffer_demo.c
# Opt level: O2

int main(int argc,char **argv)

{
  char *__ptr;
  int iVar1;
  int iVar2;
  bool bVar3;
  strbuffer_t buffer;
  
  strbuffer_init(&buffer,0x14,10);
  for (iVar1 = 0x41; iVar1 != 0x5b; iVar1 = iVar1 + 1) {
    strbuffer_reset(&buffer);
    iVar2 = 300;
    while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
      strbuffer_append(&buffer,(char)iVar1);
      __ptr = strbuffer_tostring(&buffer);
      printf("text = %s\n",__ptr);
      printf("buffer capacity = %d, pos = %d, increment = %d\n",(ulong)(uint)buffer.capacity,
             (ulong)(uint)buffer.pos,(ulong)(uint)buffer.increment);
      free(__ptr);
    }
  }
  return 0;
}

Assistant:

int main(int argc, char*argv[])
{
    strbuffer_t buffer;
    strbuffer_init(&buffer, 20, 10);
    for (int letter='A'; letter <= 'Z'; letter++)
    {
        strbuffer_reset(&buffer);
        for (int i=0; i < 300; i++)
        {
            strbuffer_append(&buffer, letter);
            char* text = strbuffer_tostring(&buffer);
            printf("text = %s\n", text);
            printf("buffer capacity = %d, pos = %d, increment = %d\n", buffer.capacity, buffer.pos, buffer.increment);
            free(text);
        }
    }
}